

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message.cpp
# Opt level: O2

bool __thiscall
bidfx_public_api::price::pixie::LoginMessage::operator==(LoginMessage *this,LoginMessage *other)

{
  __type _Var1;
  
  _Var1 = std::operator==(&this->username_,&other->username_);
  if (_Var1) {
    _Var1 = std::operator==(&this->password_,&other->password_);
    if (_Var1) {
      _Var1 = std::operator==(&this->alias_,&other->alias_);
      if (_Var1) {
        _Var1 = std::operator==(&this->application_,&other->application_);
        if (_Var1) {
          _Var1 = std::operator==(&this->application_version_,&other->application_version_);
          if (_Var1) {
            _Var1 = std::operator==(&this->api_,&other->api_);
            if (_Var1) {
              _Var1 = std::operator==(&this->api_version_,&other->api_version_);
              if (_Var1) {
                _Var1 = std::operator==(&this->product_,&other->product_);
                if (_Var1) {
                  _Var1 = std::operator==(&this->product_serial_number_,
                                          &other->product_serial_number_);
                  return _Var1;
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

const bool LoginMessage::operator==(const LoginMessage& other) const
{
    return  username_ == other.username_ &&
            password_ == other.password_ &&
            alias_ == other.alias_ &&
            application_ == other.application_ &&
            application_version_ == other.application_version_ &&
            api_ == other.api_ && api_version_ == other.api_version_ &&
            product_ == other.product_ &&
            product_serial_number_ == other.product_serial_number_;
}